

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

bool __thiscall
glslang::TGlslIoMapper::doMap(TGlslIoMapper *this,TIoMapResolver *resolver,TInfoSink *infoSink)

{
  bool *hadError;
  TVarLiveMap **uniform;
  _Rb_tree_color _Var1;
  TVarLiveMap *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  TIntermNode *pTVar6;
  bool bVar7;
  int iVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *this_01;
  iterator iVar11;
  TQualifier *this_02;
  TType *type;
  undefined4 extraout_var;
  long lVar12;
  byte bVar13;
  TVarLivePair *var_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar14;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i_1;
  pointer pTVar15;
  TVarLiveMap **ppTVar16;
  TVarLiveMap **ppTVar17;
  size_t stage_2;
  int stage;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  TVarLiveVector *__range4;
  _Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *this_03;
  long lVar18;
  TVarLiveVector *__range4_2;
  TVarLiveVector uniformVector;
  int stride;
  TResolverInOutAdaptor inOutResolve;
  TResolverUniformAdaptor uniformResolve;
  int size;
  _Base_ptr local_508;
  TIntermSymbol *pTStack_500;
  uint local_4f8;
  TLayoutPacking TStack_4f4;
  _List_node_base *p_Stack_4f0;
  _Base_ptr local_4e8;
  TIntermediate *pTStack_4e0;
  TSymbolValidater symbolValidater;
  TVarLiveVector outVectors [14];
  TVarLiveVector inVectors [14];
  
  bVar13 = 0;
  (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
  if (this->hadError == false) {
    hadError = &this->hadError;
    uniform = this->uniformVarMap;
    ppTVar16 = uniform;
    ppTVar17 = uniformResolve.uniformVarMap;
    for (lVar12 = 0xe; lVar12 != 0; lVar12 = lVar12 + -1) {
      *ppTVar17 = *ppTVar16;
      ppTVar16 = ppTVar16 + (ulong)bVar13 * -2 + 1;
      ppTVar17 = ppTVar17 + (ulong)bVar13 * -2 + 1;
    }
    ppTVar16 = this->inVarMaps;
    ppTVar17 = this->outVarMaps;
    inOutResolve.stage = EShLangCount;
    inOutResolve.resolver = resolver;
    inOutResolve.infoSink = infoSink;
    inOutResolve.error = hadError;
    uniformResolve.stage = EShLangCount;
    uniformResolve.resolver = resolver;
    uniformResolve.infoSink = infoSink;
    uniformResolve.error = hadError;
    TSymbolValidater::TSymbolValidater
              (&symbolValidater,resolver,infoSink,ppTVar16,ppTVar17,uniform,hadError,this->profile,
               this->version);
    memset(inVectors,0,0x150);
    memset(outVectors,0,0x150);
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*resolver->_vptr_TIoMapResolver[0xe])(resolver,0xe);
    for (lVar12 = 0; lVar12 != 0xe; lVar12 = lVar12 + 1) {
      pTVar2 = ppTVar16[lVar12];
      if (pTVar2 != (TVarLiveMap *)0x0) {
        this_03 = &inVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
        ;
        inOutResolve.stage = (EShLanguage)lVar12;
        for (p_Var9 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          TVarLivePair::TVarLivePair
                    ((TVarLivePair *)&size,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      *)(p_Var9 + 1));
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     this_03,(value_type *)&size);
        }
        pTVar3 = (this_03->_M_impl).super__Vector_impl_data._M_start;
        pTVar4 = inVectors[lVar12].
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pTVar3 != pTVar4) {
          uVar10 = ((long)pTVar4 - (long)pTVar3) / 0x58;
          lVar18 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                    (pTVar3,pTVar4,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)pTVar4 - (long)pTVar3 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                      (pTVar3,pTVar4);
          }
          else {
            pTVar15 = pTVar3 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                      (pTVar3,pTVar15);
            for (; pTVar15 != pTVar4; pTVar15 = pTVar15 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                        (pTVar15);
            }
          }
        }
        pTVar2 = ppTVar17[lVar12];
        this_01 = &outVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
        ;
        for (p_Var9 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          TVarLivePair::TVarLivePair
                    ((TVarLivePair *)&size,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      *)(p_Var9 + 1));
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     this_01,(value_type *)&size);
        }
        pTVar3 = (this_01->_M_impl).super__Vector_impl_data._M_start;
        pTVar4 = outVectors[lVar12].
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pTVar3 != pTVar4) {
          uVar10 = ((long)pTVar4 - (long)pTVar3) / 0x58;
          lVar18 = 0x3f;
          if (uVar10 != 0) {
            for (; uVar10 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                    (pTVar3,pTVar4,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)pTVar4 - (long)pTVar3 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                      (pTVar3,pTVar4);
          }
          else {
            pTVar15 = pTVar3 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                      (pTVar3,pTVar15);
            for (; pTVar15 != pTVar4; pTVar15 = pTVar15 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                        (pTVar15);
            }
          }
        }
        ppVar5 = &(inVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_03->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          TSymbolValidater::operator()(&symbolValidater,ppVar14);
        }
        ppVar5 = &(inVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_03->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          TResolverInOutAdaptor::operator()(&inOutResolve,ppVar14);
        }
        ppVar5 = &(outVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_01->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          TSymbolValidater::operator()(&symbolValidater,ppVar14);
        }
        ppVar5 = &(outVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_01->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          TResolverInOutAdaptor::operator()(&inOutResolve,ppVar14);
        }
        ppVar5 = &(inVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_03->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  *)&size,ppVar14);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&ppTVar16[lVar12]->_M_t,(key_type *)&size);
          if ((_Rb_tree_header *)iVar11._M_node !=
              &(ppTVar16[lVar12]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar11._M_node[3]._M_parent = local_4e8;
            iVar11._M_node[3]._M_left = (_Base_ptr)pTStack_4e0;
            iVar11._M_node[2]._M_right = (_Base_ptr)CONCAT44(TStack_4f4,local_4f8);
            *(_List_node_base **)(iVar11._M_node + 3) = p_Stack_4f0;
            iVar11._M_node[2]._M_parent = local_508;
            iVar11._M_node[2]._M_left = (_Base_ptr)pTStack_500;
          }
        }
        ppVar5 = &(outVectors[lVar12].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar14 = &((this_01->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  *)&size,ppVar14);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&ppTVar17[lVar12]->_M_t,(key_type *)&size);
          if ((_Rb_tree_header *)iVar11._M_node !=
              &(ppTVar17[lVar12]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar11._M_node[3]._M_parent = local_4e8;
            iVar11._M_node[3]._M_left = (_Base_ptr)pTStack_4e0;
            iVar11._M_node[2]._M_right = (_Base_ptr)CONCAT44(TStack_4f4,local_4f8);
            *(_List_node_base **)(iVar11._M_node + 3) = p_Stack_4f0;
            iVar11._M_node[2]._M_parent = local_508;
            iVar11._M_node[2]._M_left = (_Base_ptr)pTStack_500;
          }
        }
      }
      pTVar2 = uniform[lVar12];
      if (pTVar2 != (TVarLiveMap *)0x0) {
        uniformResolve.stage = (EShLanguage)lVar12;
        for (p_Var9 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          TVarLivePair::TVarLivePair
                    ((TVarLivePair *)&size,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      *)(p_Var9 + 1));
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
          emplace_back<glslang::TVarLivePair>(&uniformVector,(TVarLivePair *)&size);
        }
      }
    }
    pTVar3 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar18 = (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = lVar18 / 0x58;
      lVar12 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                (uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar18 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                  (pTVar3,pTVar4);
      }
      else {
        pTVar15 = pTVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                  (pTVar3,pTVar15);
        for (; pTVar15 != pTVar4; pTVar15 = pTVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                    (pTVar15);
        }
      }
    }
    pTVar3 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (ppVar14 = &(uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ; ppVar14 !=
          &pTVar3->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ; ppVar14 = ppVar14 + 1) {
      TSymbolValidater::operator()(&symbolValidater,ppVar14);
    }
    pTVar3 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (ppVar14 = &(uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ; ppVar14 !=
          &pTVar3->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ; ppVar14 = ppVar14 + 1) {
      TResolverUniformAdaptor::operator()(&uniformResolve,ppVar14);
    }
    pTVar3 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = uniformVector.
             super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar18 = (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = lVar18 / 0x58;
      lVar12 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                (uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar18 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                  (pTVar3,pTVar4);
      }
      else {
        pTVar15 = pTVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                  (pTVar3,pTVar15);
        for (; pTVar15 != pTVar4; pTVar15 = pTVar15 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                    (pTVar15);
        }
      }
    }
    (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
    if ((this->autoPushConstantBlockName)._M_string_length != 0) {
      bVar7 = false;
      for (lVar12 = 0; lVar12 != 0xe; lVar12 = lVar12 + 1) {
        if (((this->intermediates[lVar12] != (TIntermediate *)0x0) &&
            (iVar11 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                      ::find(&uniformResolve.uniformVarMap[lVar12]->_M_t,
                             &this->autoPushConstantBlockName),
            (_Rb_tree_header *)iVar11._M_node !=
            &(uniformResolve.uniformVarMap[lVar12]->_M_t)._M_impl.super__Rb_tree_header)) &&
           (this_02 = (TQualifier *)(**(code **)(*(long *)iVar11._M_node[2]._M_left + 0x108))(),
           (*(uint *)&this_02->field_0x8 & 0x7f) == 5)) {
          type = (TType *)(**(code **)(*(long *)iVar11._M_node[2]._M_left + 0xf8))();
          TIntermediate::getBaseAlignment
                    (type,&size,&stride,this->autoPushConstantBlockPacking,
                     (uint)((ulong)*(undefined8 *)&this_02->field_0x8 >> 0x3d) == 1);
          if (size <= (int)this->autoPushConstantMaxSize) {
            TQualifier::setBlockStorage(this_02,EbsPushConstant);
            this_02->field_0x10 =
                 this_02->field_0x10 & 0xf0 | (char)this->autoPushConstantBlockPacking & 0xf;
            *(ulong *)&this_02->field_0x1c =
                 *(ulong *)&this_02->field_0x1c & 0xffffffffffc07fff | 0x1f8000;
            *(undefined4 *)((long)&iVar11._M_node[2]._M_right + 4) = 0;
            iVar11._M_node[3]._M_color = ~_S_red;
            *(undefined4 *)&iVar11._M_node[3].field_0x4 = 0xffffffff;
            *(undefined4 *)&iVar11._M_node[3]._M_parent = 0xffffffff;
            *(undefined4 *)((long)&iVar11._M_node[3]._M_parent + 4) = 0xffffffff;
            *(undefined4 *)&iVar11._M_node[3]._M_left = 0xffffffff;
            bVar7 = true;
          }
        }
      }
      if (bVar7) {
        pTVar3 = uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (__lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __lhs != (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     pTVar3;
            __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &__lhs[2]._M_dataplus._M_p) {
          bVar7 = std::operator==(__lhs,&this->autoPushConstantBlockName);
          if (bVar7) {
            *(TLayoutPacking *)((long)&__lhs[1]._M_string_length + 4) =
                 this->autoPushConstantBlockPacking;
            *(undefined4 *)((long)&__lhs[1].field_2 + 4) = 0x3f;
          }
        }
      }
    }
    for (lVar12 = 0; lVar12 != 0xe; lVar12 = lVar12 + 1) {
      if (this->intermediates[lVar12] != (TIntermediate *)0x0) {
        pTVar3 = uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (ppVar14 = &(uniformVector.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 !=
              &pTVar3->
               super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar14 = ppVar14 + 1) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                  *)&size,ppVar14);
          this_00 = &uniformResolve.uniformVarMap[lVar12]->_M_t;
          iVar8 = (*(pTStack_500->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(this_00,(key_type *)CONCAT44(extraout_var,iVar8));
          if (((_Rb_tree_header *)iVar11._M_node !=
               &(uniformResolve.uniformVarMap[lVar12]->_M_t)._M_impl.super__Rb_tree_header) &&
             (iVar11._M_node[2]._M_parent == local_508)) {
            if (TStack_4f4 == ElpNone) {
              _Var1 = iVar11._M_node[3]._M_color;
              iVar11._M_node[3]._M_parent = local_4e8;
              iVar11._M_node[3]._M_left = (_Base_ptr)pTStack_4e0;
              iVar11._M_node[2]._M_right = (_Base_ptr)(ulong)local_4f8;
              *(_List_node_base **)(iVar11._M_node + 3) = p_Stack_4f0;
              iVar11._M_node[2]._M_parent = local_508;
              iVar11._M_node[2]._M_left = (_Base_ptr)pTStack_500;
              if (0 < (int)_Var1) {
                iVar11._M_node[3]._M_color = _Var1;
              }
            }
            else {
              *(TLayoutPacking *)((long)&iVar11._M_node[2]._M_right + 4) = TStack_4f4;
            }
          }
        }
        TVarSetTraverser::TVarSetTraverser
                  ((TVarSetTraverser *)&size,this->intermediates[lVar12],this->inVarMaps[lVar12],
                   this->outVarMaps[lVar12],uniformResolve.uniformVarMap[lVar12]);
        pTVar6 = this->intermediates[lVar12]->treeRoot;
        (*pTVar6->_vptr_TIntermNode[2])(pTVar6,(TVarSetTraverser *)&size);
        TLiveTraverser::~TLiveTraverser((TLiveTraverser *)&size);
      }
    }
    bVar7 = *hadError;
    std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~_Vector_base
              (&uniformVector.
                super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>);
    lVar12 = 0x138;
    do {
      std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
      ~_Vector_base((_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                    ((long)&outVectors[0].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    lVar12 = 0x138;
    do {
      std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
      ~_Vector_base((_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                    ((long)&inVectors[0].
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar12));
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != -0x18);
    bVar13 = bVar7 ^ 1;
  }
  else {
    bVar13 = 0;
  }
  return (bool)bVar13;
}

Assistant:

bool TGlslIoMapper::doMap(TIoMapResolver* resolver, TInfoSink& infoSink) {
    resolver->endResolve(EShLangCount);
    if (!hadError) {
        //Resolve uniform location, ubo/ssbo/opaque bindings across stages
        TResolverUniformAdaptor uniformResolve(EShLangCount, *resolver, uniformVarMap, infoSink, hadError);
        TResolverInOutAdaptor inOutResolve(EShLangCount, *resolver, infoSink, hadError);
        TSymbolValidater symbolValidater(*resolver, infoSink, inVarMaps,
                                         outVarMaps, uniformVarMap, hadError, profile, version);

        TVarLiveVector inVectors[EShLangCount];
        TVarLiveVector outVectors[EShLangCount];
        TVarLiveVector uniformVector;

        resolver->beginResolve(EShLangCount);
        for (int stage = EShLangVertex; stage < EShLangCount; stage++) {
            if (inVarMaps[stage] != nullptr) {
                inOutResolve.setStage(EShLanguage(stage));

                // copy vars into a sorted list
                std::for_each(inVarMaps[stage]->begin(), inVarMaps[stage]->end(),
                        [&inVectors, stage](TVarLivePair p) { inVectors[stage].push_back(p); });
                std::sort(inVectors[stage].begin(), inVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                std::for_each(outVarMaps[stage]->begin(), outVarMaps[stage]->end(),
                        [&outVectors, stage](TVarLivePair p) { outVectors[stage].push_back(p); });
                std::sort(outVectors[stage].begin(), outVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                for (auto& var : inVectors[stage]) { symbolValidater(var); }
                for (auto& var : inVectors[stage]) { inOutResolve(var); }
                for (auto& var : outVectors[stage]) { symbolValidater(var); }
                for (auto& var : outVectors[stage]) { inOutResolve(var); }

                // copy results back into maps
                std::for_each(inVectors[stage].begin(), inVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = inVarMaps[stage]->find(p.first);
                        if (at != inVarMaps[stage]->end())
                            at->second = p.second;
                });

                std::for_each(outVectors[stage].begin(), outVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = outVarMaps[stage]->find(p.first);
                        if (at != outVarMaps[stage]->end())
                            at->second = p.second;
                });

            }
            if (uniformVarMap[stage] != nullptr) {
                uniformResolve.setStage(EShLanguage(stage));
                for (auto& var : *(uniformVarMap[stage])) { uniformVector.push_back(var); }
            }
        }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriorityAndLive()(p1.second, p2.second);
        });
        for (auto& var : uniformVector) { symbolValidater(var); }
        for (auto& var : uniformVector) { uniformResolve(var); }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
        });
        resolver->endResolve(EShLangCount);
        if (autoPushConstantBlockName.length()) {
            bool upgraded = false;
            for (size_t stage = 0; stage < EShLangCount; stage++) {
                if (intermediates[stage] != nullptr) {
                    TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                    auto at = pUniformVarMap[stage]->find(autoPushConstantBlockName);
                    if (at == pUniformVarMap[stage]->end())
                        continue;
                    TQualifier& qualifier = at->second.symbol->getQualifier();
                    if (!qualifier.isUniform())
                        continue;
                    TType& t = at->second.symbol->getWritableType();
                    int size, stride;
                    TIntermediate::getBaseAlignment(t, size, stride, autoPushConstantBlockPacking,
                                                    qualifier.layoutMatrix == ElmRowMajor);
                    if (size <= int(autoPushConstantMaxSize)) {
                        qualifier.setBlockStorage(EbsPushConstant);
                        qualifier.layoutPacking = autoPushConstantBlockPacking;
                        // Push constants don't have set/binding etc. decorations, remove those.
                        qualifier.layoutSet = TQualifier::layoutSetEnd;
                        at->second.clearNewAssignments();

                        upgraded = true;
                    }
                }
            }
            // If it's been upgraded to push_constant, then set the flag so when its traversed
            // in the next for loop, all references to this symbol will get their flag changed.
            // so it doesn't get a set/binding assigned to it.
            if (upgraded) {
                std::for_each(uniformVector.begin(), uniformVector.end(),
                                       [this](TVarLivePair& p) {
                if (p.first == autoPushConstantBlockName) {
                        p.second.upgradedToPushConstantPacking = autoPushConstantBlockPacking;
                        p.second.newSet = TQualifier::layoutSetEnd;
                    }
                });
            }
        }
        for (size_t stage = 0; stage < EShLangCount; stage++) {
            if (intermediates[stage] != nullptr) {
                // traverse each stage, set new location to each input/output and unifom symbol, set new binding to
                // ubo, ssbo and opaque symbols. Assign push_constant upgrades as well.
                TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                std::for_each(uniformVector.begin(), uniformVector.end(), [pUniformVarMap, stage](TVarLivePair p) {
                    auto at = pUniformVarMap[stage]->find(p.second.symbol->getAccessName());
                    if (at != pUniformVarMap[stage]->end() && at->second.id == p.second.id){
                        if (p.second.upgradedToPushConstantPacking != ElpNone) {
                            at->second.upgradedToPushConstantPacking = p.second.upgradedToPushConstantPacking;
                        } else {
                            int resolvedBinding = at->second.newBinding;
                            at->second = p.second;
                            if (resolvedBinding > 0)
                                at->second.newBinding = resolvedBinding;
                        }
                    }
                });
                TVarSetTraverser iter_iomap(*intermediates[stage], *inVarMaps[stage], *outVarMaps[stage],
                                            *uniformResolve.uniformVarMap[stage]);
                intermediates[stage]->getTreeRoot()->traverse(&iter_iomap);
            }
        }
        return !hadError;
    } else {
        return false;
    }
}